

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O3

void XmlReporter__will_report_a_failing_test(void)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  va_list null_arguments;
  __va_list_tag local_38;
  
  local_38.gp_offset = 0;
  local_38.fp_offset = 0;
  local_38.overflow_arg_area = (void *)0x0;
  local_38.reg_save_area = (void *)0x0;
  (*reporter->start_test)(reporter,"test_name");
  (*reporter->show_fail)(reporter,"file",2,"test_name",&local_38);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar3 = output;
  uVar1 = create_contains_string_constraint
                    ("<failure message=\"test_name\">","\"<failure message=\\\"test_name\\\">\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x7d,"output",pcVar3,uVar1);
  pcVar3 = output;
  uVar1 = create_contains_string_constraint
                    ("<location file=\"file\" line=\"2\"/>",
                     "\"<location file=\\\"file\\\" line=\\\"2\\\"/>\"");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x7e,"output",pcVar3,uVar1);
  pcVar3 = output;
  pcVar2 = strstr(output,"time=");
  pcVar3 = strstr(pcVar3,"<failure");
  uVar1 = create_less_than_value_constraint(pcVar3,"strstr(output, \"<failure\")");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/xml_reporter_tests.c"
               ,0x7f,"strstr(output, \"time=\")",pcVar2,uVar1);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}